

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

int fiorso_getgame(char *saved_file,char *fnamebuf,size_t buflen)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  size_t sVar7;
  long in_RDX;
  void *in_RSI;
  char *in_RDI;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  byte bVar21;
  char buf [18];
  uint namelen;
  osfildef *fp;
  char local_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  undefined1 auStack_38 [12];
  uint local_2c;
  FILE *local_28;
  long local_20;
  void *local_18;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_28 = fopen(in_RDI,"rb");
  if (local_28 != (FILE *)0x0) {
    sVar7 = fread(&local_48,0x12,1,local_28);
    if (sVar7 == 1) {
      cVar8 = -(cStack_46 == 'D');
      cVar9 = -(cStack_45 == 'S');
      cVar10 = -(cStack_44 == '2');
      cVar11 = -(cStack_43 == ' ');
      cVar12 = -(cStack_42 == 's');
      cVar13 = -(cStack_41 == 'a');
      cVar14 = -(cStack_40 == 'v');
      cVar15 = -(cStack_3f == 'e');
      cVar16 = -(cStack_3e == '/');
      cVar17 = -(cStack_3d == 'g');
      cVar18 = -(cStack_3c == '\n');
      cVar19 = -(cStack_3b == '\r');
      cVar20 = -(cStack_3a == '\x1a');
      bVar21 = -(cStack_39 == '\0');
      auVar1[1] = -(cStack_47 == 'A');
      auVar1[0] = -(local_48 == 'T');
      auVar1[2] = cVar8;
      auVar1[3] = cVar9;
      auVar1[4] = cVar10;
      auVar1[5] = cVar11;
      auVar1[6] = cVar12;
      auVar1[7] = cVar13;
      auVar1[8] = cVar14;
      auVar1[9] = cVar15;
      auVar1[10] = cVar16;
      auVar1[0xb] = cVar17;
      auVar1[0xc] = cVar18;
      auVar1[0xd] = cVar19;
      auVar1[0xe] = cVar20;
      auVar1[0xf] = bVar21;
      auVar2[1] = -(cStack_47 == 'A');
      auVar2[0] = -(local_48 == 'T');
      auVar2[2] = cVar8;
      auVar2[3] = cVar9;
      auVar2[4] = cVar10;
      auVar2[5] = cVar11;
      auVar2[6] = cVar12;
      auVar2[7] = cVar13;
      auVar2[8] = cVar14;
      auVar2[9] = cVar15;
      auVar2[10] = cVar16;
      auVar2[0xb] = cVar17;
      auVar2[0xc] = cVar18;
      auVar2[0xd] = cVar19;
      auVar2[0xe] = cVar20;
      auVar2[0xf] = bVar21;
      auVar6[1] = cVar9;
      auVar6[0] = cVar8;
      auVar6[2] = cVar10;
      auVar6[3] = cVar11;
      auVar6[4] = cVar12;
      auVar6[5] = cVar13;
      auVar6[6] = cVar14;
      auVar6[7] = cVar15;
      auVar6[8] = cVar16;
      auVar6[9] = cVar17;
      auVar6[10] = cVar18;
      auVar6[0xb] = cVar19;
      auVar6[0xc] = cVar20;
      auVar6[0xd] = bVar21;
      auVar5[1] = cVar10;
      auVar5[0] = cVar9;
      auVar5[2] = cVar11;
      auVar5[3] = cVar12;
      auVar5[4] = cVar13;
      auVar5[5] = cVar14;
      auVar5[6] = cVar15;
      auVar5[7] = cVar16;
      auVar5[8] = cVar17;
      auVar5[9] = cVar18;
      auVar5[10] = cVar19;
      auVar5[0xb] = cVar20;
      auVar5[0xc] = bVar21;
      auVar4[1] = cVar11;
      auVar4[0] = cVar10;
      auVar4[2] = cVar12;
      auVar4[3] = cVar13;
      auVar4[4] = cVar14;
      auVar4[5] = cVar15;
      auVar4[6] = cVar16;
      auVar4[7] = cVar17;
      auVar4[8] = cVar18;
      auVar4[9] = cVar19;
      auVar4[10] = cVar20;
      auVar4[0xb] = bVar21;
      auVar3[1] = cVar12;
      auVar3[0] = cVar11;
      auVar3[2] = cVar13;
      auVar3[3] = cVar14;
      auVar3[4] = cVar15;
      auVar3[5] = cVar16;
      auVar3[6] = cVar17;
      auVar3[7] = cVar18;
      auVar3[8] = cVar19;
      auVar3[9] = cVar20;
      auVar3[10] = bVar21;
      if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 |
                   (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3 |
                   (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                   (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                   (ushort)((byte)(CONCAT19(bVar21,CONCAT18(cVar20,CONCAT17(cVar19,CONCAT16(cVar18,
                                                  CONCAT15(cVar17,CONCAT14(cVar16,CONCAT13(cVar15,
                                                  CONCAT12(cVar14,CONCAT11(cVar13,cVar12))))))))) >>
                                  7) & 1) << 6 |
                   (ushort)((byte)(CONCAT18(bVar21,CONCAT17(cVar20,CONCAT16(cVar19,CONCAT15(cVar18,
                                                  CONCAT14(cVar17,CONCAT13(cVar16,CONCAT12(cVar15,
                                                  CONCAT11(cVar14,cVar13)))))))) >> 7) & 1) << 7 |
                  (ushort)(bVar21 >> 7) << 0xf) == 0xffff) {
        local_2c = osrp2(auStack_38);
        if (local_20 - 1U < (ulong)local_2c) {
          local_2c = (int)local_20 - 1;
        }
        sVar7 = fread(local_18,(ulong)local_2c,1,local_28);
        if (sVar7 == 1) {
          *(undefined1 *)((long)local_18 + (ulong)local_2c) = 0;
          fclose(local_28);
          return 1;
        }
        fclose(local_28);
        return 0;
      }
    }
    fclose(local_28);
  }
  return 0;
}

Assistant:

int fiorso_getgame(char *saved_file, char *fnamebuf, size_t buflen)
{
    osfildef *fp;
    uint      namelen;
    char      buf[sizeof(FIOSAVHDR_PREFIX) + 2];

    /* open the input file */
    if (!(fp = osfoprb(saved_file, OSFTSAVE)))
        return FALSE;

    /* read the prefix header and check */
    if (osfrb(fp, buf, (int)(sizeof(FIOSAVHDR_PREFIX) + 2))
        || memcmp(buf, FIOSAVHDR_PREFIX, sizeof(FIOSAVHDR_PREFIX)) != 0)
    {
        /* 
         *   there's no game file information - close the file and
         *   indicate that we have no information 
         */
        osfcls(fp);
        return FALSE;
    }

    /* get the length of the filename */
    namelen = osrp2(buf + sizeof(FIOSAVHDR_PREFIX));
    if (namelen > buflen - 1)
        namelen = buflen - 1;

    /* read the filename */
    if (osfrb(fp, fnamebuf, namelen))
    {
        osfcls(fp);
        return FALSE;
    }

    /* null-terminate the string */
    fnamebuf[namelen] = '\0';

    /* done with the file */
    osfcls(fp);

    /* indicate that we found the information */
    return TRUE;
}